

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O3

Abc_Ntk_t * Io_ReadAiger(char *pFileName,int fCheck)

{
  byte bVar1;
  long *plVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  gzFile file;
  byte *pbVar8;
  FILE *pFVar9;
  BZFILE *b;
  void *buf;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Abc_Ntk_t *pAVar10;
  char *pcVar11;
  ulong *puVar12;
  Abc_Obj_t *pAVar13;
  void *pvVar14;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pObj;
  byte *pbVar16;
  Vec_Ptr_t *pVVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  void *__src;
  ulong uVar22;
  byte *pbVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  char *pcVar27;
  uint uVar28;
  uint uVar29;
  void *pvVar30;
  ulong uVar31;
  long lVar32;
  byte *pbVar33;
  Vec_Ptr_t **ppVVar34;
  bool bVar35;
  byte *local_a8;
  byte *local_a0;
  Abc_Ntk_t *local_98;
  FILE *local_90;
  uint *local_88;
  int local_7c;
  Abc_Obj_t *local_78;
  ProgressBar *local_70;
  int local_68;
  int local_64;
  byte *local_60;
  undefined4 local_54;
  Abc_Obj_t *local_50;
  Abc_Obj_t *local_48;
  Vec_Int_t *local_40;
  ulong local_38;
  
  sVar7 = strlen(pFileName);
  iVar4 = strncmp(pFileName + (sVar7 - 4),".bz2",4);
  if (iVar4 == 0) {
    pFVar9 = fopen(pFileName,"rb");
    if (pFVar9 == (FILE *)0x0) {
      puts("Ioa_ReadLoadFileBz2(): The file is unavailable (absent or open).");
      iVar4 = -1;
      pbVar8 = (byte *)0x0;
    }
    else {
      iVar4 = 0;
      local_a0 = (byte *)pFileName;
      b = BZ2_bzReadOpen(&local_64,(FILE *)pFVar9,0,0,(void *)0x0,0);
      if (local_64 == 0) {
        pvVar14 = (void *)0x0;
        pvVar30 = (void *)0x0;
        local_90 = pFVar9;
        local_68 = fCheck;
        do {
          buf = malloc(0x100010);
          __src = buf;
          if (pvVar30 != (void *)0x0) {
            *(void **)((long)pvVar14 + 0x100008) = buf;
            __src = pvVar30;
          }
          iVar5 = BZ2_bzRead(&local_64,b,buf,0x100000);
          fCheck = local_68;
          *(int *)((long)buf + 0x100000) = iVar5;
          iVar4 = iVar4 + iVar5;
          *(undefined8 *)((long)buf + 0x100008) = 0;
          pvVar14 = buf;
          pvVar30 = __src;
        } while (local_64 == 0);
        if (local_64 == -5) {
          BZ2_bzReadClose(&local_64,b);
          pFVar9 = local_90;
          fseek(local_90,0,2);
          lVar32 = ftell(pFVar9);
          fCheck = local_68;
          iVar4 = (int)lVar32;
          if (iVar4 == 0) {
            pcVar27 = "Ioa_ReadLoadFileBz2(): The file is empty.";
            goto LAB_00887e68;
          }
          pbVar8 = (byte *)malloc((long)(iVar4 + 10));
          rewind(pFVar9);
          fread(pbVar8,(long)iVar4,1,pFVar9);
          pFileName = (char *)local_a0;
        }
        else {
          if (local_64 != 4) {
            pcVar27 = "Ioa_ReadLoadFileBz2(): Unable to read the compressed BLIF.";
LAB_00887e68:
            fCheck = local_68;
            puts(pcVar27);
            goto LAB_00887e75;
          }
          BZ2_bzReadClose(&local_64,b);
          pbVar8 = (byte *)malloc((long)(iVar4 + 10));
          iVar5 = 0;
          do {
            memcpy(pbVar8 + iVar5,__src,(long)*(int *)((long)__src + 0x100000));
            iVar5 = iVar5 + *(int *)((long)__src + 0x100000);
            pvVar14 = *(void **)((long)__src + 0x100008);
            free(__src);
            pFVar9 = local_90;
            __src = pvVar14;
            pFileName = (char *)local_a0;
          } while (pvVar14 != (void *)0x0);
        }
LAB_00887c70:
        fclose(pFVar9);
      }
      else {
        printf("Ioa_ReadLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n");
LAB_00887e75:
        pbVar8 = (byte *)0x0;
        iVar4 = -1;
        pFileName = (char *)local_a0;
      }
    }
  }
  else {
    if (((pFileName[sVar7 - 3] != '.') || (pFileName[sVar7 - 2] != 'g')) ||
       (pFileName[sVar7 - 1] != 'z')) {
      iVar4 = Extra_FileSize(pFileName);
      pFVar9 = fopen(pFileName,"rb");
      pbVar8 = (byte *)malloc((long)iVar4);
      fread(pbVar8,(long)iVar4,1,pFVar9);
      goto LAB_00887c70;
    }
    file = gzopen(pFileName,"rb");
    pbVar8 = (byte *)malloc(100000);
    lVar32 = 0;
    while (iVar4 = gzread(file,pbVar8 + lVar32,100000), iVar4 == 100000) {
      if (pbVar8 == (byte *)0x0) {
        pbVar8 = (byte *)malloc(lVar32 + 200000U);
      }
      else {
        pbVar8 = (byte *)realloc(pbVar8,lVar32 + 200000U);
      }
      lVar32 = lVar32 + 100000;
    }
    if (iVar4 == -1) {
      __assert_fail("amtRead != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                    ,0xd7,"char *Ioa_ReadLoadFileGzAig(char *, int *)");
    }
    iVar4 = iVar4 + (int)lVar32;
    gzclose(file);
  }
  if (((*pbVar8 == 0x61) && (pbVar8[1] == 0x69)) &&
     ((pbVar8[2] == 0x67 && ((pbVar33 = pbVar8, pbVar8[3] == 0x32 || (pbVar8[3] == 0x20)))))) {
    do {
      bVar18 = *pbVar33;
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar5 = atoi((char *)pbVar33);
    local_a0 = (byte *)CONCAT44(local_a0._4_4_,iVar5);
    do {
      bVar18 = *pbVar33;
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar5 = atoi((char *)pbVar33);
    local_78 = (Abc_Obj_t *)CONCAT44(extraout_var,iVar5);
    do {
      bVar18 = *pbVar33;
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar5 = atoi((char *)pbVar33);
    local_50 = (Abc_Obj_t *)CONCAT44(extraout_var_00,iVar5);
    do {
      bVar18 = *pbVar33;
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar5 = atoi((char *)pbVar33);
    do {
      bVar18 = *pbVar33;
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar6 = atoi((char *)pbVar33);
    local_48 = (Abc_Obj_t *)CONCAT44(extraout_var_01,iVar6);
    do {
      bVar18 = *pbVar33;
      if (bVar18 == 10) {
        local_54 = 0;
        goto LAB_00887fc5;
      }
      pbVar33 = pbVar33 + 1;
    } while (bVar18 != 0x20);
    local_a8 = pbVar33;
    iVar6 = atoi((char *)pbVar33);
    for (; (*pbVar33 != 10 && (*pbVar33 != 0x20)); pbVar33 = pbVar33 + 1) {
    }
    iVar5 = iVar5 + iVar6;
    local_54 = CONCAT31((int3)((uint)iVar6 >> 8),iVar6 != 0);
LAB_00887fc5:
    bVar18 = *pbVar33;
    bVar35 = false;
    if (bVar18 == 0x20) {
      pbVar33 = pbVar33 + 1;
      local_a8 = pbVar33;
      iVar6 = atoi((char *)pbVar33);
      for (; (*pbVar33 != 10 && (*pbVar33 != 0x20)); pbVar33 = pbVar33 + 1) {
      }
      local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,iVar6 + iVar5);
      bVar18 = *pbVar33;
      if (bVar18 == 0x20) {
        pbVar33 = pbVar33 + 1;
        local_a8 = pbVar33;
        local_7c = iVar6;
        iVar5 = atoi((char *)pbVar33);
        for (; (*pbVar33 != 10 && (*pbVar33 != 0x20)); pbVar33 = pbVar33 + 1) {
        }
        local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,(int)local_70 + iVar5);
        bVar35 = iVar5 != 0;
        bVar18 = *pbVar33;
        iVar6 = local_7c;
        local_a8 = pbVar33;
        if (bVar18 == 0x20) {
          pbVar33 = pbVar33 + 1;
          local_a8 = pbVar33;
          iVar6 = atoi((char *)pbVar33);
          for (; (*pbVar33 != 10 && (*pbVar33 != 0x20)); pbVar33 = pbVar33 + 1) {
          }
          local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,(int)local_70 + iVar6);
          bVar18 = *pbVar33;
          bVar35 = iVar5 != 0 || iVar6 != 0;
          iVar6 = local_7c;
          local_a8 = pbVar33;
        }
      }
      else {
        bVar35 = false;
        local_a8 = pbVar33;
      }
    }
    else {
      local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,iVar5);
      iVar6 = 0;
      local_a8 = pbVar33;
    }
    if (bVar18 == 10) {
      local_a8 = local_a8 + 1;
      uVar26 = (int)local_50 + (int)local_78;
      local_38 = (ulong)uVar26;
      uVar26 = uVar26 + (int)local_48;
      local_60 = pbVar8;
      if ((uint)local_a0 == uVar26) {
        if (!bVar35) {
          local_7c = iVar6;
          if (iVar6 != 0) {
            if (iVar6 == 1) {
              fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n");
            }
          }
          pAVar10 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
          pcVar27 = Extra_FileNameGeneric(pFileName);
          pcVar11 = Extra_UtilStrsav(pcVar27);
          pAVar10->pName = pcVar11;
          pcVar11 = Extra_UtilStrsav(pFileName);
          pAVar10->pSpec = pcVar11;
          if (pcVar27 != (char *)0x0) {
            free(pcVar27);
          }
          pAVar10->nConstrs = local_7c;
          iVar5 = (int)local_48;
          iVar6 = (int)local_38;
          local_88 = (uint *)malloc(0x10);
          pAVar15 = local_78;
          pbVar8 = &DAT_00000008;
          if (6 < uVar26) {
            pbVar8 = (byte *)(ulong)(iVar5 + iVar6 + 1);
          }
          uVar26 = (uint)pbVar8;
          *local_88 = uVar26;
          local_98 = pAVar10;
          if (uVar26 == 0) {
            local_90 = (FILE *)(local_88 + 2);
            pAVar13 = Abc_AigConst1(pAVar10);
            puVar12 = (ulong *)malloc(0x80);
            *(ulong **)(local_88 + 2) = puVar12;
            *local_88 = 0x10;
            local_a0 = &DAT_00000010;
          }
          else {
            local_a0 = pbVar8;
            puVar12 = (ulong *)malloc((long)(int)uVar26 << 3);
            local_90 = (FILE *)(local_88 + 2);
            *(ulong **)(local_88 + 2) = puVar12;
            pAVar13 = Abc_AigConst1(pAVar10);
          }
          local_88[1] = 1;
          *puVar12 = (ulong)pAVar13 ^ 1;
          if ((int)pAVar15 < 1) {
            uVar24 = 1;
          }
          else {
            uVar24 = 1;
            uVar26 = 2;
            do {
              pAVar13 = Abc_NtkCreateObj(local_98,ABC_OBJ_PI);
              iVar5 = (int)local_a0;
              if ((int)uVar24 == iVar5) {
                if (iVar5 < 0x10) {
                  if (*(void **)local_90 == (void *)0x0) {
                    pvVar14 = malloc(0x80);
                  }
                  else {
                    pvVar14 = realloc(*(void **)local_90,0x80);
                  }
                  *(void **)(local_88 + 2) = pvVar14;
                  *local_88 = 0x10;
                  local_a0 = &DAT_00000010;
                }
                else {
                  local_a0 = (byte *)(ulong)(uint)(iVar5 * 2);
                  if (*(void **)local_90 == (void *)0x0) {
                    pvVar14 = malloc((long)local_a0 * 8);
                  }
                  else {
                    pvVar14 = realloc(*(void **)local_90,(long)local_a0 * 8);
                  }
                  *(void **)(local_88 + 2) = pvVar14;
                  *local_88 = (uint)local_a0;
                }
              }
              else {
                pvVar14 = *(void **)local_90;
              }
              local_88[1] = uVar26;
              *(Abc_Obj_t **)((long)pvVar14 + uVar24 * 8) = pAVar13;
              uVar24 = uVar24 + 1;
              iVar5 = uVar26 - (int)pAVar15;
              uVar26 = uVar26 + 1;
            } while (iVar5 != 1);
          }
          pAVar10 = local_98;
          iVar5 = (int)local_70;
          if (0 < (int)local_70) {
            do {
              Abc_NtkCreateObj(pAVar10,ABC_OBJ_PO);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          local_68 = fCheck;
          if (0 < (int)local_50) {
            uVar22 = (ulong)local_50 & 0xffffffff;
            uVar31 = (long)(int)uVar24;
            do {
              pAVar15 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_LATCH);
              if ((*(uint *)&pAVar15->field_0x14 & 0xf) != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
              }
              pAVar15->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              pAVar13 = Abc_NtkCreateObj(pAVar10,ABC_OBJ_BI);
              pObj = Abc_NtkCreateObj(pAVar10,ABC_OBJ_BO);
              Abc_ObjAddFanin(pAVar15,pAVar13);
              local_78 = pObj;
              Abc_ObjAddFanin(pObj,pAVar15);
              pAVar10 = local_98;
              iVar5 = (int)local_a0;
              if ((int)uVar31 == iVar5) {
                if (iVar5 < 0x10) {
                  if (*(void **)local_90 == (void *)0x0) {
                    pvVar14 = malloc(0x80);
                  }
                  else {
                    pvVar14 = realloc(*(void **)local_90,0x80);
                  }
                  *(void **)(local_88 + 2) = pvVar14;
                  *local_88 = 0x10;
                  local_a0 = &DAT_00000010;
                }
                else {
                  local_a0 = (byte *)(ulong)(uint)(iVar5 * 2);
                  if (*(void **)local_90 == (void *)0x0) {
                    pvVar14 = malloc((long)local_a0 * 8);
                  }
                  else {
                    pvVar14 = realloc(*(void **)local_90,(long)local_a0 * 8);
                  }
                  *(void **)(local_88 + 2) = pvVar14;
                  *local_88 = (uint)local_a0;
                }
              }
              else {
                pvVar14 = *(void **)local_90;
              }
              uVar24 = uVar31 + 1;
              local_88[1] = (uint)uVar24;
              *(Abc_Obj_t **)((long)pvVar14 + uVar31 * 8) = local_78;
              uVar26 = (int)uVar22 - 1;
              uVar22 = (ulong)uVar26;
              uVar31 = uVar24;
            } while (uVar26 != 0);
          }
          if (local_60[3] == 0x20) {
            iVar5 = (int)local_70 + (int)local_50;
            pbVar33 = local_a8;
            if (iVar5 != 0 && SCARRY4((int)local_70,(int)local_50) == iVar5 < 0) {
              iVar6 = 0;
              pbVar8 = local_a8;
              do {
                pbVar33 = pbVar8 + 1;
                iVar6 = iVar6 + (uint)(*pbVar8 == 10);
                pbVar8 = pbVar33;
              } while (iVar6 < iVar5);
            }
            local_40 = (Vec_Int_t *)0x0;
            pbVar8 = local_a8;
            local_a8 = pbVar33;
          }
          else {
            local_40 = Io_WriteDecodeLiterals((char **)&local_a8,(int)local_70 + (int)local_50);
            pbVar8 = (byte *)0x0;
          }
          pbVar33 = local_a8;
          iVar5 = (int)local_48;
          local_70 = Extra_ProgressBarStart((FILE *)_stdout,iVar5);
          if (iVar5 < 1) {
            uVar26 = (uint)uVar24;
          }
          else {
            pAVar15 = (Abc_Obj_t *)0x0;
            do {
              iVar5 = (int)pAVar15;
              if ((local_70 == (ProgressBar *)0x0) || (local_70->nItemsNext <= iVar5)) {
                Extra_ProgressBarUpdate_int(local_70,iVar5,(char *)0x0);
              }
              bVar18 = *pbVar33;
              bVar3 = 0;
              bVar19 = 0;
              uVar26 = 0;
              while( true ) {
                pbVar23 = pbVar33 + 1;
                if (-1 < (char)bVar18) break;
                uVar26 = uVar26 | (bVar18 & 0x7f) << (bVar19 & 0x1f);
                bVar18 = *pbVar23;
                bVar19 = bVar19 + 7;
                pbVar33 = pbVar23;
              }
              uVar20 = (uint)*pbVar23;
              pbVar33 = pbVar33 + 2;
              if ((char)*pbVar23 < '\0') {
                bVar3 = 0;
                uVar25 = 0;
                do {
                  uVar25 = uVar25 | (uVar20 & 0x7f) << (bVar3 & 0x1f);
                  bVar1 = *pbVar33;
                  uVar20 = (uint)bVar1;
                  pbVar33 = pbVar33 + 1;
                  bVar3 = bVar3 + 7;
                } while ((char)bVar1 < '\0');
              }
              else {
                uVar25 = 0;
              }
              uVar28 = (int)local_38 + iVar5 + 1;
              uVar29 = uVar28 * 2;
              uVar21 = uVar29 - ((uint)bVar18 << (bVar19 & 0x1f) | uVar26);
              uVar25 = uVar21 - (uVar20 << (bVar3 & 0x1f) | uVar25);
              uVar20 = uVar25 >> 1;
              uVar26 = (uint)uVar24;
              if (((int)uVar26 <= (int)uVar20) || (uVar26 <= uVar21 >> 1)) goto LAB_00888deb;
              local_78 = pAVar15;
              if (uVar26 != uVar28) {
                __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                              ,0x199,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
              }
              pvVar14 = *(void **)local_90;
              pAVar13 = Abc_AigAnd((Abc_Aig_t *)local_98->pManFunc,
                                   (Abc_Obj_t *)
                                   ((ulong)(uVar25 & 1) ^
                                   *(ulong *)((long)pvVar14 + (ulong)uVar20 * 8)),
                                   (Abc_Obj_t *)
                                   ((ulong)(uVar21 & 1) ^
                                   *(ulong *)((long)pvVar14 + (ulong)(uVar21 >> 1) * 8)));
              if (uVar26 == (uint)local_a0) {
                local_50 = pAVar13;
                if ((uint)local_a0 < 0x10) {
                  pvVar14 = realloc(pvVar14,0x80);
                  uVar29 = 0x10;
                }
                else {
                  pvVar14 = realloc(pvVar14,(ulong)uVar29 << 3);
                }
                *(void **)(local_88 + 2) = pvVar14;
                *local_88 = uVar29;
                local_a0 = (byte *)(ulong)uVar29;
                pAVar13 = local_50;
              }
              uVar20 = (int)local_78 + 1;
              pAVar15 = (Abc_Obj_t *)(ulong)uVar20;
              uVar26 = uVar26 + 1;
              local_88[1] = uVar26;
              *(Abc_Obj_t **)((long)pvVar14 + (uVar24 & 0xffffffff) * 8) = pAVar13;
              uVar24 = (ulong)uVar26;
            } while (uVar20 != (uint)local_48);
          }
          Extra_ProgressBarStop(local_70);
          pbVar23 = local_60;
          pAVar10 = local_98;
          pVVar17 = local_98->vBoxes;
          local_a8 = pbVar8;
          if (local_60[3] == 0x20) {
            local_a0 = (byte *)CONCAT44(local_a0._4_4_,uVar26);
            if (0 < pVVar17->nSize) {
              uVar24 = 0;
              do {
                plVar2 = (long *)pVVar17->pArray[uVar24];
                pbVar23 = local_60;
                if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
                  local_78 = *(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8);
                  uVar26 = atoi((char *)pbVar8);
                  do {
                    bVar18 = *pbVar8;
                    if (bVar18 == 10) goto LAB_00888763;
                    pbVar8 = pbVar8 + 1;
                  } while (bVar18 != 0x20);
                  local_a8 = pbVar8;
                  iVar5 = atoi((char *)pbVar8);
                  if (iVar5 == 0) {
                    lVar32 = 1;
                  }
                  else if (iVar5 == 1) {
                    lVar32 = 2;
                  }
                  else {
                    iVar6 = local_98->vPis->nSize + (int)uVar24 + 1;
                    if (iVar6 < 0) {
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x12e,"int Abc_Var2Lit(int, int)");
                    }
                    lVar32 = 3;
                    if (iVar5 != iVar6 * 2) {
                      __assert_fail("Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                                    ,0x1b3,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
                    }
                  }
                  plVar2[7] = lVar32;
                  for (; (*pbVar8 != 10 && (*pbVar8 != 0x20)); pbVar8 = pbVar8 + 1) {
                  }
LAB_00888763:
                  pbVar23 = local_60;
                  if (*pbVar8 != 10) {
                    local_a8 = pbVar8;
                    fprintf(_stdout,"The initial value of latch number %d is not recongnized.\n",
                            uVar24 & 0xffffffff);
                    return (Abc_Ntk_t *)0x0;
                  }
                  pbVar8 = pbVar8 + 1;
                  local_a8 = pbVar8;
                  if ((int)(uint)local_a0 <= (int)(uVar26 >> 1)) goto LAB_00888deb;
                  Abc_ObjAddFanin(local_78,(Abc_Obj_t *)
                                           ((ulong)(uVar26 & 1) ^
                                           *(ulong *)(*(long *)local_90 + (ulong)(uVar26 >> 1) * 8))
                                 );
                  pVVar17 = local_98->vBoxes;
                }
                uVar24 = uVar24 + 1;
              } while ((long)uVar24 < (long)pVVar17->nSize);
            }
            pVVar17 = local_98->vPos;
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                pAVar15 = (Abc_Obj_t *)pVVar17->pArray[lVar32];
                uVar26 = atoi((char *)pbVar8);
                do {
                  bVar18 = *pbVar8;
                  pbVar8 = pbVar8 + 1;
                } while (bVar18 != 10);
                if ((int)(uint)local_a0 <= (int)(uVar26 >> 1)) goto LAB_00888deb;
                Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)
                                        ((ulong)(uVar26 & 1) ^
                                        *(ulong *)(*(long *)local_90 + (ulong)(uVar26 >> 1) * 8)));
                lVar32 = lVar32 + 1;
                pVVar17 = local_98->vPos;
              } while (lVar32 < pVVar17->nSize);
            }
          }
          else {
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                plVar2 = (long *)pVVar17->pArray[lVar32];
                if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
                  if (local_40->nSize <= lVar32) goto LAB_00888e0a;
                  uVar20 = (uint)local_40->pArray[lVar32] >> 1;
                  if ((int)uVar26 <= (int)uVar20) goto LAB_00888deb;
                  Abc_ObjAddFanin(*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8),
                                  (Abc_Obj_t *)
                                  ((ulong)(local_40->pArray[lVar32] & 1) ^
                                  *(ulong *)(*(long *)local_90 + (ulong)uVar20 * 8)));
                  pVVar17 = pAVar10->vBoxes;
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < pVVar17->nSize);
            }
            pVVar17 = pAVar10->vPos;
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                uVar24 = (ulong)(uint)pAVar10->nObjCounts[8] + lVar32;
                iVar5 = (int)uVar24;
                if ((iVar5 < 0) || (local_40->nSize <= iVar5)) {
LAB_00888e0a:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar20 = (uint)local_40->pArray[uVar24 & 0xffffffff] >> 1;
                if ((int)uVar26 <= (int)uVar20) goto LAB_00888deb;
                Abc_ObjAddFanin((Abc_Obj_t *)pVVar17->pArray[lVar32],
                                (Abc_Obj_t *)
                                ((ulong)(local_40->pArray[uVar24 & 0xffffffff] & 1) ^
                                *(ulong *)(*(long *)local_90 + (ulong)uVar20 * 8)));
                lVar32 = lVar32 + 1;
                pVVar17 = pAVar10->vPos;
              } while (lVar32 < pVVar17->nSize);
            }
            Vec_IntFree(local_40);
          }
          local_a0 = pbVar23 + iVar4;
          local_a8 = pbVar33;
          if ((pbVar33 < local_a0) && (*pbVar33 != 99)) {
            local_78 = (Abc_Obj_t *)&local_98->vPos;
            local_48 = (Abc_Obj_t *)&local_98->vBoxes;
            ppVVar34 = &local_98->vPis;
            do {
              pbVar8 = local_a8;
              bVar18 = *local_a8;
              pAVar15 = (Abc_Obj_t *)ppVVar34;
              switch(bVar18) {
              case 0x62:
              case 0x66:
              case 0x6a:
              case 0x6f:
                pAVar15 = local_78;
                break;
              case 99:
                goto switchD_00888ac8_caseD_63;
              default:
                return (Abc_Ntk_t *)0x0;
              case 0x69:
                break;
              case 0x6c:
                pAVar15 = local_48;
              }
              pAVar10 = pAVar15->pNtk;
              pbVar23 = local_a8 + 1;
              local_a8 = pbVar23;
              uVar26 = atoi((char *)pbVar23);
              do {
                bVar3 = *pbVar23;
                pbVar23 = pbVar23 + 1;
              } while (bVar3 != 0x20);
              local_a8 = pbVar23;
              if ((int)pAVar10->ntkFunc <= (int)uVar26) {
                fwrite("The number of terminal is out of bound.\n",0x28,1,_stdout);
                return (Abc_Ntk_t *)0x0;
              }
              if ((int)uVar26 < 0) {
LAB_00888deb:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pAVar15 = *(Abc_Obj_t **)(pAVar10->pName + (ulong)uVar26 * 8);
              if (bVar18 == 0x6c) {
                pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanouts).pArray];
              }
              do {
                pbVar16 = local_a8;
                local_a8 = pbVar16 + 1;
              } while (*pbVar16 != 10);
              *pbVar16 = 0;
              Abc_ObjAssignName(pAVar15,(char *)pbVar23,(char *)0x0);
              if (*pbVar8 == 0x6c) {
                pAVar13 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                pcVar27 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar13,pcVar27,"L");
                plVar2 = (long *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                pAVar13 = *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
                pcVar27 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar13,pcVar27,"_in");
              }
              pcVar27 = Abc_ObjName(pAVar15);
              (pAVar15->field_6).pTemp = pcVar27;
            } while (local_a8 < local_a0);
switchD_00888ac8_caseD_63:
            pAVar10 = local_98;
            pVVar17 = local_98->vPis;
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                pAVar15 = (Abc_Obj_t *)pVVar17->pArray[lVar32];
                if ((pAVar15->field_6).pTemp == (void *)0x0) {
                  pcVar27 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar15,pcVar27,(char *)0x0);
                  pVVar17 = pAVar10->vPis;
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < pVVar17->nSize);
            }
            pVVar17 = pAVar10->vBoxes;
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                plVar2 = (long *)pVVar17->pArray[lVar32];
                if (((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) &&
                   (pAVar15 = *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)plVar2[6] * 8), (pAVar15->field_6).pTemp == (void *)0x0
                   )) {
                  pcVar27 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar15,pcVar27,(char *)0x0);
                  pAVar13 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                  pcVar27 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar13,pcVar27,"L");
                  plVar2 = (long *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                  pAVar13 = *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8
                             );
                  pcVar27 = Abc_ObjName(pAVar15);
                  pAVar10 = local_98;
                  Abc_ObjAssignName(pAVar13,pcVar27,"_in");
                  pVVar17 = pAVar10->vBoxes;
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < pVVar17->nSize);
            }
            iVar4 = local_68;
            pVVar17 = pAVar10->vPos;
            bVar18 = (byte)local_54;
            if (0 < pVVar17->nSize) {
              lVar32 = 0;
              do {
                pAVar15 = (Abc_Obj_t *)pVVar17->pArray[lVar32];
                if ((pAVar15->field_6).pTemp == (void *)0x0) {
                  pcVar27 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar15,pcVar27,(char *)0x0);
                  pVVar17 = local_98->vPos;
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < pVVar17->nSize);
            }
          }
          else {
            Abc_NtkShortNames(local_98);
            bVar18 = (byte)local_54;
            iVar4 = local_68;
          }
          pAVar10 = local_98;
          pbVar8 = pbVar33 + 1;
          local_a8 = pbVar33;
          if ((((pbVar8 < local_a0) && (*pbVar33 == 99)) && (local_a8 = pbVar8, *pbVar8 == 0x6e)) &&
             (pbVar8 = pbVar33 + 2, local_a8 = pbVar8, pbVar33[2] != 0)) {
            if (local_98->pName != (char *)0x0) {
              free(local_98->pName);
              pAVar10->pName = (char *)0x0;
            }
            pcVar27 = Extra_UtilStrsav((char *)pbVar8);
            pAVar10->pName = pcVar27;
          }
          free(local_60);
          if (*(void **)local_90 != (void *)0x0) {
            free(*(void **)local_90);
          }
          bVar35 = local_7c == 0;
          free(local_88);
          pAVar10 = local_98;
          Abc_AigCleanup((Abc_Aig_t *)local_98->pManFunc);
          if ((~bVar18 & bVar35) == 0) {
            Abc_NtkInvertConstraints(pAVar10);
          }
          if (iVar4 != 0) {
            iVar4 = Abc_NtkCheckRead(pAVar10);
            if (iVar4 == 0) {
              puts("Io_ReadAiger: The network check has failed.");
              Abc_NtkDelete(pAVar10);
              return (Abc_Ntk_t *)0x0;
            }
            return pAVar10;
          }
          return pAVar10;
        }
        pcVar27 = "Reading AIGER files with liveness properties is currently not supported.\n";
        sVar7 = 0x49;
      }
      else {
        pcVar27 = "The number of objects does not match.\n";
        sVar7 = 0x26;
      }
      fwrite(pcVar27,sVar7,1,_stdout);
      pbVar8 = local_60;
      goto LAB_00887f8e;
    }
    pcVar27 = "The parameter line is in a wrong format.\n";
    sVar7 = 0x29;
  }
  else {
    pcVar27 = "Wrong input file format.\n";
    sVar7 = 0x19;
  }
  fwrite(pcVar27,sVar7,1,_stdout);
LAB_00887f8e:
  free(pbVar8);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadAiger( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes, * vTerms;
    Vec_Int_t * vLits = NULL;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    int nFileSize = -1, iTerm, nDigits, i;
    char * pContents, * pDrivers = NULL, * pSymbols, * pCur, * pName, * pType;
    unsigned uLit0, uLit1, uLit;
    int RetValue;

    // read the file into the buffer
    if ( !strncmp(pFileName+strlen(pFileName)-4,".bz2",4) )
        pContents = Ioa_ReadLoadFileBz2Aig( pFileName, &nFileSize );
    else if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) )
        pContents = Ioa_ReadLoadFileGzAig( pFileName, &nFileSize );
    else
    {
//        pContents = Ioa_ReadLoadFile( pFileName );
        nFileSize = Extra_FileSize( pFileName );
        pFile = fopen( pFileName, "rb" );
        pContents = ABC_ALLOC( char, nFileSize );
        RetValue = fread( pContents, nFileSize, 1, pFile );
        fclose( pFile );
    }


    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
//        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties is currently not supported.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pName = Extra_FileNameGeneric( pFileName );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );
    ABC_FREE( pName );
    pNtkNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_ObjNot( Abc_AigConst1(pNtkNew) ) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
    }
    // create the latches
    nDigits = Abc_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Abc_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
    

    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // remember the beginning of latch/PO literals
        pDrivers = pCur;
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    { 
        vLits = Io_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Io_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Io_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    pCur = pDrivers;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
            if ( *pCur == ' ' ) // read initial value
            {
                int Init;
                pCur++;
                Init = atoi( pCur );
                if ( Init == 0 )
                    Abc_LatchSetInit0( Abc_NtkBox(pNtkNew, i) );
                else if ( Init == 1 )
                    Abc_LatchSetInit1( Abc_NtkBox(pNtkNew, i) );
                else 
                {
                    assert( Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0) ); 
                    // unitialized value of the latch is the latch literal according to http://fmv.jku.at/hwmcc11/beyond1.pdf
                    Abc_LatchSetInitDc( Abc_NtkBox(pNtkNew, i) );
                }
                while ( *pCur != ' ' && *pCur != '\n' ) pCur++;
            }
            if ( *pCur != '\n' )
            {
                fprintf( stdout, "The initial value of latch number %d is not recongnized.\n", i );
                return NULL;
            }
            pCur++;

            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
    }
    else
    {
        // read the latch driver literals
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i+Abc_NtkLatchNum(pNtkNew) );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        Vec_IntFree( vLits );
    }
 
    // read the names if present
    pCur = pSymbols;
    if ( pCur < pContents + nFileSize && *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNtkNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNtkNew->vBoxes;
            else if ( *pCur == 'o' || *pCur == 'b' || *pCur == 'c' || *pCur == 'j' || *pCur == 'f' )
                vTerms = pNtkNew->vPos;
            else
            {
//                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = (Abc_Obj_t *)Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Abc_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Abc_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
                Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
        } 

        // assign the remaining names
        Abc_NtkForEachPi( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
        Abc_NtkForEachLatchOutput( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
            Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            Counter++;
        }
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
//        if ( Counter )
//            printf( "Io_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Io_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Abc_NtkShortNames( pNtkNew );
    }

    // read the name of the model if given
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            if ( strlen(pCur) > 0 )
            {
                ABC_FREE( pNtkNew->pName );
                pNtkNew->pName = Extra_UtilStrsav( pCur );
            }
        }
    }

    // skipping the comments
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Abc_NtkInvertConstraints( pNtkNew );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadAiger: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}